

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O2

string * __thiscall
adios2::transport::FileHTTP::SysErrMsg_abi_cxx11_(string *__return_storage_ptr__,FileHTTP *this)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,this->m_Errno);
  std::operator+(&bStack_78,": errno = ",&local_38);
  std::operator+(&local_58,&bStack_78,": ");
  __rhs = strerror(this->m_Errno);
  std::operator+(__return_storage_ptr__,&local_58,__rhs);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FileHTTP::SysErrMsg() const
{
    return std::string(": errno = " + std::to_string(m_Errno) + ": " + strerror(m_Errno));
}